

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder_helpers.hpp
# Opt level: O0

disp_binding_activator_t * __thiscall
so_5::disp::reuse::
binder_for_public_disp_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
::bind_agent(disp_binding_activator_t *__return_storage_ptr__,
            binder_for_public_disp_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
            *this,environment_t *env,agent_ref_t *agent)

{
  anon_class_16_2_f78083f2 *in_R8;
  binder_for_public_disp_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
  *local_38;
  intrusive_ptr_t<so_5::agent_t> local_30;
  agent_ref_t *local_28;
  agent_ref_t *agent_local;
  environment_t *env_local;
  binder_for_public_disp_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
  *this_local;
  
  local_38 = this;
  local_28 = agent;
  agent_local = (agent_ref_t *)env;
  env_local = (environment_t *)this;
  this_local = (binder_for_public_disp_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
                *)__return_storage_ptr__;
  intrusive_ptr_t<so_5::agent_t>::intrusive_ptr_t(&local_30,agent);
  do_with_dispatcher<so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>::bind_agent(so_5::environment_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::_lambda(so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t&)_1_>
            (__return_storage_ptr__,(reuse *)env,(environment_t *)&this->m_disp_name,
             (string *)&local_38,in_R8);
  binder_for_public_disp_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
  ::bind_agent(so_5::environment_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::
  {lambda(so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t&)#1}::
  ~intrusive_ptr_t((_lambda_so_5__disp__prio_one_thread__strictly_ordered__impl__proxy_dispatcher_t___1_
                    *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & env,
			agent_ref_t agent ) override
			{
				return do_with_dispatcher< DISPATCHER >(
					env,
					m_disp_name,
					[this, agent]( DISPATCHER & disp )
					{
						return this->do_bind( disp, std::move( agent ) );
					} );
			}